

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O0

ParquetColumnSchema *
duckdb::ColumnWriter::FillParquetSchema
          (vector<duckdb_parquet::SchemaElement,_true> *schemas,LogicalType *type,string *name,
          optional_ptr<const_duckdb::ChildFieldIDs,_true> field_ids,idx_t max_repeat,
          idx_t max_define,bool can_have_nulls)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar2;
  bool bVar3;
  LogicalTypeId LVar4;
  uint uVar5;
  size_type sVar6;
  pointer ppVar7;
  size_type in;
  FieldID *pFVar8;
  LogicalType *pLVar9;
  string *in_RCX;
  value_type *pvVar10;
  LogicalType *in_RDX;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> in_RSI;
  ParquetColumnSchema *in_RDI;
  string *in_R9;
  idx_t unaff_retaddr;
  long in_stack_00000008;
  undefined1 in_stack_00000010;
  SchemaElement schema_element;
  ParquetColumnSchema child_schema;
  bool is_key;
  idx_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  kv_names;
  vector<duckdb::LogicalType,_true> kv_types;
  SchemaElement kv_element;
  SchemaElement top_element;
  SchemaElement repeated_element;
  SchemaElement optional_element;
  LogicalType *child_type_1;
  bool is_list;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_type;
  const_iterator __end2;
  const_iterator __begin2;
  child_list_t<LogicalType> *__range2;
  SchemaElement schema_element_1;
  child_list_t<LogicalType> *child_types;
  iterator field_id_it;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> child_field_ids;
  optional_ptr<const_duckdb::FieldID,_true> field_id;
  idx_t schema_idx;
  type null_type;
  ParquetColumnSchema *struct_column;
  value_type *in_stack_fffffffffffff238;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this;
  undefined4 in_stack_fffffffffffff240;
  undefined4 uVar11;
  uint uVar12;
  undefined4 in_stack_fffffffffffff244;
  ParquetColumnSchema *in_stack_fffffffffffff248;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
  *in_stack_fffffffffffff250;
  SchemaElement *in_stack_fffffffffffff268;
  LogicalType *in_stack_fffffffffffff270;
  idx_t in_stack_fffffffffffff278;
  LogicalType *in_stack_fffffffffffff280;
  string *in_stack_fffffffffffff288;
  ParquetColumnSchema *in_stack_fffffffffffff290;
  idx_t in_stack_fffffffffffff2a0;
  ParquetColumnSchemaType in_stack_fffffffffffff2a8;
  LogicalType *in_stack_fffffffffffff2c0;
  string *local_d28;
  LogicalType *local_ce8;
  undefined8 local_c70;
  LogicalType local_c30 [24];
  string local_c18 [40];
  type local_bf0;
  uint local_be8;
  string local_be0 [48];
  int32_t local_bb0;
  byte local_ab8;
  ChildFieldIDs *local_ab0;
  byte local_a11;
  ulong local_a10;
  LogicalType local_a08 [24];
  string local_9f0 [35];
  undefined1 local_9cd;
  undefined1 local_9cb;
  allocator local_9ca;
  allocator local_9c9;
  string *local_9c8;
  string local_9c0 [32];
  string local_9a0 [32];
  string *local_980;
  undefined8 local_978;
  LogicalType *local_950;
  LogicalType local_948 [24];
  LogicalType local_930 [24];
  LogicalType *local_918;
  undefined8 local_910;
  undefined4 local_8e0;
  string local_8d8 [32];
  undefined4 local_8b8;
  byte local_7b0;
  uint local_798;
  string local_790 [32];
  undefined4 local_770;
  undefined4 local_76c;
  int32_t local_760;
  byte local_668;
  ChildFieldIDs *local_660;
  allocator local_651;
  string local_650 [176];
  LogicalType local_5a0 [24];
  string local_588 [39];
  undefined1 local_561;
  undefined4 local_550;
  string local_548 [32];
  undefined4 local_528;
  byte local_420;
  uint local_408;
  string local_400 [32];
  undefined4 local_3e0;
  undefined4 local_3dc;
  int32_t local_3d0;
  byte local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c1;
  ChildFieldIDs *local_2c0;
  reference local_228;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_220;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_218;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_210;
  LogicalType local_208 [24];
  string local_1f0 [35];
  undefined1 local_1cd;
  uint local_1b0;
  string local_1a8 [32];
  int local_188;
  int32_t local_178;
  byte local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_78;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> local_70;
  optional_ptr<const_duckdb::FieldID,_true> local_68;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_true>
  local_58;
  optional_ptr<const_duckdb::ChildFieldIDs,_true> local_50;
  optional_ptr<const_duckdb::FieldID,_true> local_48;
  undefined1 can_have_nulls_00;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar13;
  char cVar14;
  optional_ptr local_10 [16];
  
  uVar13 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffcc) & 0x1ffffff;
  cVar14 = (char)(uVar13 >> 0x18);
  uVar5 = (uint)(cVar14 != '\0');
  if (cVar14 == '\0') {
    in_stack_00000008 = in_stack_00000008 + -1;
  }
  sVar6 = std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          ::size((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                  *)in_RSI.ptr);
  optional_ptr<const_duckdb::FieldID,_true>::optional_ptr(&local_48);
  optional_ptr<const_duckdb::ChildFieldIDs,_true>::optional_ptr(&local_50);
  bVar3 = duckdb::optional_ptr::operator_cast_to_bool(local_10);
  if (bVar3) {
    optional_ptr<const_duckdb::ChildFieldIDs,_true>::operator->
              ((optional_ptr<const_duckdb::ChildFieldIDs,_true> *)
               CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
    ::operator->((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
                 *)in_stack_fffffffffffff238,(key_type *)0x5a0955);
    optional_ptr<const_duckdb::ChildFieldIDs,_true>::operator->
              ((optional_ptr<const_duckdb::ChildFieldIDs,_true> *)
               CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
    ::operator->((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>_>,_true>
                  *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>_>_>
                *)in_stack_fffffffffffff238);
    bVar3 = std::__detail::operator!=(&local_58,&local_60);
    if (bVar3) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::FieldID>,_false,_true>
                             *)0x5a09aa);
      optional_ptr<const_duckdb::FieldID,_true>::optional_ptr(&local_68,&ppVar7->second);
      local_48.ptr = local_68.ptr;
      pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                         ((optional_ptr<const_duckdb::FieldID,_true> *)
                          CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
      optional_ptr<const_duckdb::ChildFieldIDs,_true>::optional_ptr
                (&local_70,&pFVar8->child_field_ids);
      local_50.ptr = local_70.ptr;
    }
  }
  LVar4 = LogicalType::id(in_RDX);
  if ((LVar4 == STRUCT) || (LVar4 = LogicalType::id(in_RDX), LVar4 == UNION)) {
    local_78 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                *)duckdb::StructType::GetChildTypes_abi_cxx11_(in_RDX);
    local_1b0 = uVar5;
    duckdb_parquet::SchemaElement::SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    uVar5 = local_1b0;
    in = std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
         ::size(local_78);
    local_188 = UnsafeNumericCast<int,unsigned_long,void>(in);
    local_80 = local_80 & 0xfe | 0xc;
    std::__cxx11::string::operator=(local_1a8,in_RCX);
    bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_48);
    if ((bVar3) &&
       (pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                           ((optional_ptr<const_duckdb::FieldID,_true> *)
                            CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240)),
       (pFVar8->set & 1U) != 0)) {
      local_80 = local_80 | 0x80;
      pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                         ((optional_ptr<const_duckdb::FieldID,_true> *)
                          CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
      local_178 = pFVar8->field_id;
    }
    std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
              in_stack_fffffffffffff238);
    local_1cd = 0;
    std::__cxx11::string::string(local_1f0,in_RCX);
    duckdb::LogicalType::LogicalType(local_208,in_RDX);
    uVar11 = 0;
    this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)0x0;
    ParquetColumnSchema::ParquetColumnSchema
              (in_stack_fffffffffffff290,in_stack_fffffffffffff288,in_stack_fffffffffffff280,
               in_stack_fffffffffffff278,(idx_t)in_stack_fffffffffffff270,
               (idx_t)in_stack_fffffffffffff268,in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8)
    ;
    duckdb::LogicalType::~LogicalType(local_208);
    std::__cxx11::string::~string(local_1f0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::size(local_78);
    std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::reserve
              ((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
               in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
    local_210 = local_78;
    local_218._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ::begin(this);
    local_220 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                 *)std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ::end(this);
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff244,uVar11),
                              (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                               *)this), bVar3) {
      local_228 = __gnu_cxx::
                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                  ::operator*(&local_218);
      local_2c0 = local_50.ptr;
      this = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)(in_stack_00000008 + 1);
      uVar11 = 1;
      FillParquetSchema((vector<duckdb_parquet::SchemaElement,_true> *)in_RDX,(LogicalType *)in_RCX,
                        in_R9,in_RSI,CONCAT44(uVar13,uVar5),unaff_retaddr,SUB81(sVar6 >> 0x38,0));
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>(in_stack_fffffffffffff250,in_stack_fffffffffffff248)
      ;
      ParquetColumnSchema::~ParquetColumnSchema
                ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff244,uVar11));
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
      ::operator++(&local_218);
    }
    local_1cd = 1;
    duckdb_parquet::SchemaElement::~SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar11));
  }
  else {
    LVar4 = LogicalType::id(in_RDX);
    can_have_nulls_00 = (undefined1)(sVar6 >> 0x38);
    if (LVar4 != LIST) {
      LVar4 = LogicalType::id(in_RDX);
      can_have_nulls_00 = (undefined1)(sVar6 >> 0x38);
      if (LVar4 != ARRAY) {
        LVar4 = LogicalType::id(in_RDX);
        if (LVar4 == MAP) {
          local_798 = uVar5;
          duckdb_parquet::SchemaElement::SchemaElement
                    ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240))
          ;
          local_770 = 1;
          local_76c = 1;
          local_668 = local_668 & 0xfe | 0x1c;
          uVar5 = local_798;
          std::__cxx11::string::operator=(local_790,in_RCX);
          bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_48);
          if ((bVar3) &&
             (pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                                 ((optional_ptr<const_duckdb::FieldID,_true> *)
                                  CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240)),
             (pFVar8->set & 1U) != 0)) {
            local_668 = local_668 | 0x80;
            pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                               ((optional_ptr<const_duckdb::FieldID,_true> *)
                                CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
            local_760 = pFVar8->field_id;
          }
          std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          ::push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                       *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                      in_stack_fffffffffffff238);
          duckdb_parquet::SchemaElement::SchemaElement
                    ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240))
          ;
          local_8e0 = 2;
          local_8b8 = 2;
          local_7b0 = local_7b0 & 0xfe | 0xc;
          std::__cxx11::string::operator=(local_8d8,"key_value");
          std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          ::push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                       *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                      in_stack_fffffffffffff238);
          local_950 = local_948;
          pLVar9 = (LogicalType *)duckdb::MapType::KeyType(in_RDX);
          duckdb::LogicalType::LogicalType(local_948,pLVar9);
          local_950 = local_930;
          pLVar9 = (LogicalType *)duckdb::MapType::ValueType(in_RDX);
          duckdb::LogicalType::LogicalType(local_930,pLVar9);
          local_918 = local_948;
          local_910 = 2;
          std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x5a15d1)
          ;
          iVar1._M_len = (size_type)in_stack_fffffffffffff250;
          iVar1._M_array = (iterator)in_stack_fffffffffffff248;
          vector<duckdb::LogicalType,_true>::vector
                    ((vector<duckdb::LogicalType,_true> *)
                     CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),iVar1,
                     (allocator_type *)in_stack_fffffffffffff238);
          std::allocator<duckdb::LogicalType>::~allocator
                    ((allocator<duckdb::LogicalType> *)0x5a1605);
          local_ce8 = (LogicalType *)&local_918;
          do {
            local_ce8 = local_ce8 + -0x18;
            duckdb::LogicalType::~LogicalType(local_ce8);
          } while (local_ce8 != local_948);
          local_9cb = 1;
          local_9c8 = local_9c0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9c0,"key",&local_9c9);
          local_9c8 = local_9a0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_9a0,"value",&local_9ca);
          local_9cb = 0;
          local_980 = local_9c0;
          local_978 = 2;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x5a172e);
          iVar2._M_len = (size_type)in_stack_fffffffffffff250;
          iVar2._M_array = (iterator)in_stack_fffffffffffff248;
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),iVar2,
                   (allocator_type *)in_stack_fffffffffffff238);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x5a1762);
          local_d28 = (string *)&local_980;
          do {
            local_d28 = local_d28 + -0x20;
            std::__cxx11::string::~string(local_d28);
          } while (local_d28 != local_9c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_9ca);
          std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
          local_9cd = 0;
          std::__cxx11::string::string(local_9f0,in_RCX);
          duckdb::LogicalType::LogicalType(local_a08,in_RDX);
          uVar12 = 0;
          pvVar10 = (value_type *)0x0;
          ParquetColumnSchema::ParquetColumnSchema
                    (in_stack_fffffffffffff290,in_stack_fffffffffffff288,in_stack_fffffffffffff280,
                     in_stack_fffffffffffff278,(idx_t)in_stack_fffffffffffff270,
                     (idx_t)in_stack_fffffffffffff268,in_stack_fffffffffffff2a0,
                     in_stack_fffffffffffff2a8);
          duckdb::LogicalType::~LogicalType(local_a08);
          std::__cxx11::string::~string(local_9f0);
          std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
          reserve((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                   *)in_stack_fffffffffffff270,(size_type)in_stack_fffffffffffff268);
          for (local_a10 = 0; local_a10 < 2; local_a10 = local_a10 + 1) {
            local_a11 = local_a10 == 0;
            vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)
                       CONCAT44(in_stack_fffffffffffff244,uVar12),(size_type)pvVar10);
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)CONCAT44(in_stack_fffffffffffff244,uVar12),(size_type)pvVar10);
            local_ab0 = local_50.ptr;
            pvVar10 = (value_type *)(in_stack_00000008 + 2);
            uVar12 = (byte)~local_a11 & 1;
            FillParquetSchema((vector<duckdb_parquet::SchemaElement,_true> *)in_RDX,
                              (LogicalType *)in_RCX,in_R9,in_RSI,CONCAT44(uVar13,uVar5),
                              unaff_retaddr,SUB81(sVar6 >> 0x38,0));
            std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
            push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       *)CONCAT44(in_stack_fffffffffffff244,uVar12),pvVar10);
            ParquetColumnSchema::~ParquetColumnSchema
                      ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff244,uVar12));
          }
          local_9cd = 1;
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)0x5a1c46);
          vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x5a1c53);
          duckdb_parquet::SchemaElement::~SchemaElement
                    ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar12));
          duckdb_parquet::SchemaElement::~SchemaElement
                    ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar12));
          return in_RDI;
        }
        duckdb_parquet::SchemaElement::SchemaElement
                  ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
        local_be8 = uVar5;
        local_bf0 = ParquetWriter::DuckDBTypeToParquetType(in_stack_fffffffffffff2c0);
        local_ab8 = local_ab8 & 0xf7 | 5;
        std::__cxx11::string::operator=(local_be0,in_RCX);
        bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_48);
        if ((bVar3) &&
           (pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                               ((optional_ptr<const_duckdb::FieldID,_true> *)
                                CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240)),
           (pFVar8->set & 1U) != 0)) {
          local_ab8 = local_ab8 | 0x80;
          pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                             ((optional_ptr<const_duckdb::FieldID,_true> *)
                              CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
          local_bb0 = pFVar8->field_id;
        }
        ParquetWriter::SetSchemaProperties(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
        std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
        push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                   *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
                  in_stack_fffffffffffff238);
        std::__cxx11::string::string(local_c18,in_RCX);
        duckdb::LogicalType::LogicalType(local_c30,in_RDX);
        uVar11 = 0;
        ParquetColumnSchema::ParquetColumnSchema
                  (in_stack_fffffffffffff290,in_stack_fffffffffffff288,in_stack_fffffffffffff280,
                   in_stack_fffffffffffff278,(idx_t)in_stack_fffffffffffff270,
                   (idx_t)in_stack_fffffffffffff268,in_stack_fffffffffffff2a0,
                   in_stack_fffffffffffff2a8);
        duckdb::LogicalType::~LogicalType(local_c30);
        std::__cxx11::string::~string(local_c18);
        duckdb_parquet::SchemaElement::~SchemaElement
                  ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar11));
        return in_RDI;
      }
    }
    LVar4 = LogicalType::id(in_RDX);
    local_2c1 = LVar4 == LIST;
    if ((bool)local_2c1) {
      local_c70 = duckdb::ListType::GetChildType(in_RDX);
      local_408 = uVar5;
    }
    else {
      local_c70 = duckdb::ArrayType::GetChildType(in_RDX);
      local_408 = uVar5;
    }
    local_2d0 = local_c70;
    duckdb_parquet::SchemaElement::SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    local_3e0 = 1;
    local_3dc = 3;
    local_2d8 = local_2d8 & 0xfe | 0x1c;
    uVar5 = local_408;
    std::__cxx11::string::operator=(local_400,in_RCX);
    bVar3 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_48);
    if ((bVar3) &&
       (pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                           ((optional_ptr<const_duckdb::FieldID,_true> *)
                            CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240)),
       (pFVar8->set & 1U) != 0)) {
      local_2d8 = local_2d8 | 0x80;
      pFVar8 = optional_ptr<const_duckdb::FieldID,_true>::operator->
                         ((optional_ptr<const_duckdb::FieldID,_true> *)
                          CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
      local_3d0 = pFVar8->field_id;
    }
    std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
              in_stack_fffffffffffff238);
    duckdb_parquet::SchemaElement::SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240));
    local_550 = 2;
    local_528 = 1;
    local_420 = local_420 & 0xfe | 0xc;
    std::__cxx11::string::operator=(local_548,"list");
    std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
    push_back((vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               *)CONCAT44(in_stack_fffffffffffff244,in_stack_fffffffffffff240),
              in_stack_fffffffffffff238);
    local_561 = 0;
    std::__cxx11::string::string(local_588,in_RCX);
    duckdb::LogicalType::LogicalType(local_5a0,in_RDX);
    ParquetColumnSchema::ParquetColumnSchema
              (in_stack_fffffffffffff290,in_stack_fffffffffffff288,in_stack_fffffffffffff280,
               in_stack_fffffffffffff278,(idx_t)in_stack_fffffffffffff270,
               (idx_t)in_stack_fffffffffffff268,in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8)
    ;
    duckdb::LogicalType::~LogicalType(local_5a0);
    std::__cxx11::string::~string(local_588);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"element",&local_651);
    local_660 = local_50.ptr;
    pvVar10 = (value_type *)(in_stack_00000008 + 2);
    uVar11 = 1;
    FillParquetSchema((vector<duckdb_parquet::SchemaElement,_true> *)in_RDX,(LogicalType *)in_RCX,
                      in_R9,in_RSI,CONCAT44(uVar13,uVar5),unaff_retaddr,(bool)can_have_nulls_00);
    std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
    push_back((vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> *)
              CONCAT44(in_stack_fffffffffffff244,uVar11),pvVar10);
    ParquetColumnSchema::~ParquetColumnSchema
              ((ParquetColumnSchema *)CONCAT44(in_stack_fffffffffffff244,uVar11));
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    local_561 = 1;
    duckdb_parquet::SchemaElement::~SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar11));
    duckdb_parquet::SchemaElement::~SchemaElement
              ((SchemaElement *)CONCAT44(in_stack_fffffffffffff244,uVar11));
  }
  return in_RDI;
}

Assistant:

ParquetColumnSchema ColumnWriter::FillParquetSchema(vector<duckdb_parquet::SchemaElement> &schemas,
                                                    const LogicalType &type, const string &name,
                                                    optional_ptr<const ChildFieldIDs> field_ids, idx_t max_repeat,
                                                    idx_t max_define, bool can_have_nulls) {
	auto null_type = can_have_nulls ? FieldRepetitionType::OPTIONAL : FieldRepetitionType::REQUIRED;
	if (!can_have_nulls) {
		max_define--;
	}
	idx_t schema_idx = schemas.size();

	optional_ptr<const FieldID> field_id;
	optional_ptr<const ChildFieldIDs> child_field_ids;
	if (field_ids) {
		auto field_id_it = field_ids->ids->find(name);
		if (field_id_it != field_ids->ids->end()) {
			field_id = &field_id_it->second;
			child_field_ids = &field_id->child_field_ids;
		}
	}

	if (type.id() == LogicalTypeId::STRUCT || type.id() == LogicalTypeId::UNION) {
		auto &child_types = StructType::GetChildTypes(type);
		// set up the schema element for this struct
		duckdb_parquet::SchemaElement schema_element;
		schema_element.repetition_type = null_type;
		schema_element.num_children = UnsafeNumericCast<int32_t>(child_types.size());
		schema_element.__isset.num_children = true;
		schema_element.__isset.type = false;
		schema_element.__isset.repetition_type = true;
		schema_element.name = name;
		if (field_id && field_id->set) {
			schema_element.__isset.field_id = true;
			schema_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(schema_element));

		ParquetColumnSchema struct_column(name, type, max_define, max_repeat, schema_idx, 0);
		// construct the child schemas recursively
		struct_column.children.reserve(child_types.size());
		for (auto &child_type : child_types) {
			struct_column.children.emplace_back(FillParquetSchema(schemas, child_type.second, child_type.first,
			                                                      child_field_ids, max_repeat, max_define + 1));
		}
		return struct_column;
	}
	if (type.id() == LogicalTypeId::LIST || type.id() == LogicalTypeId::ARRAY) {
		auto is_list = type.id() == LogicalTypeId::LIST;
		auto &child_type = is_list ? ListType::GetChildType(type) : ArrayType::GetChildType(type);
		// set up the two schema elements for the list
		// for some reason we only set the converted type in the OPTIONAL element
		// first an OPTIONAL element
		duckdb_parquet::SchemaElement optional_element;
		optional_element.repetition_type = null_type;
		optional_element.num_children = 1;
		optional_element.converted_type = ConvertedType::LIST;
		optional_element.__isset.num_children = true;
		optional_element.__isset.type = false;
		optional_element.__isset.repetition_type = true;
		optional_element.__isset.converted_type = true;
		optional_element.name = name;
		if (field_id && field_id->set) {
			optional_element.__isset.field_id = true;
			optional_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(optional_element));

		// then a REPEATED element
		duckdb_parquet::SchemaElement repeated_element;
		repeated_element.repetition_type = FieldRepetitionType::REPEATED;
		repeated_element.num_children = 1;
		repeated_element.__isset.num_children = true;
		repeated_element.__isset.type = false;
		repeated_element.__isset.repetition_type = true;
		repeated_element.name = "list";
		schemas.push_back(std::move(repeated_element));

		ParquetColumnSchema list_column(name, type, max_define, max_repeat, schema_idx, 0);
		list_column.children.push_back(
		    FillParquetSchema(schemas, child_type, "element", child_field_ids, max_repeat + 1, max_define + 2));
		return list_column;
	}
	if (type.id() == LogicalTypeId::MAP) {
		// map type
		// maps are stored as follows:
		// <map-repetition> group <name> (MAP) {
		// 	repeated group key_value {
		// 		required <key-type> key;
		// 		<value-repetition> <value-type> value;
		// 	}
		// }
		// top map element
		duckdb_parquet::SchemaElement top_element;
		top_element.repetition_type = null_type;
		top_element.num_children = 1;
		top_element.converted_type = ConvertedType::MAP;
		top_element.__isset.repetition_type = true;
		top_element.__isset.num_children = true;
		top_element.__isset.converted_type = true;
		top_element.__isset.type = false;
		top_element.name = name;
		if (field_id && field_id->set) {
			top_element.__isset.field_id = true;
			top_element.field_id = field_id->field_id;
		}
		schemas.push_back(std::move(top_element));

		// key_value element
		duckdb_parquet::SchemaElement kv_element;
		kv_element.repetition_type = FieldRepetitionType::REPEATED;
		kv_element.num_children = 2;
		kv_element.__isset.repetition_type = true;
		kv_element.__isset.num_children = true;
		kv_element.__isset.type = false;
		kv_element.name = "key_value";
		schemas.push_back(std::move(kv_element));

		// construct the child types recursively
		vector<LogicalType> kv_types {MapType::KeyType(type), MapType::ValueType(type)};
		vector<string> kv_names {"key", "value"};

		ParquetColumnSchema map_column(name, type, max_define, max_repeat, schema_idx, 0);
		map_column.children.reserve(2);
		for (idx_t i = 0; i < 2; i++) {
			// key needs to be marked as REQUIRED
			bool is_key = i == 0;
			auto child_schema = FillParquetSchema(schemas, kv_types[i], kv_names[i], child_field_ids, max_repeat + 1,
			                                      max_define + 2, !is_key);

			map_column.children.push_back(std::move(child_schema));
		}
		return map_column;
	}
	duckdb_parquet::SchemaElement schema_element;
	schema_element.type = ParquetWriter::DuckDBTypeToParquetType(type);
	schema_element.repetition_type = null_type;
	schema_element.__isset.num_children = false;
	schema_element.__isset.type = true;
	schema_element.__isset.repetition_type = true;
	schema_element.name = name;
	if (field_id && field_id->set) {
		schema_element.__isset.field_id = true;
		schema_element.field_id = field_id->field_id;
	}
	ParquetWriter::SetSchemaProperties(type, schema_element);
	schemas.push_back(std::move(schema_element));
	return ParquetColumnSchema(name, type, max_define, max_repeat, schema_idx, 0);
}